

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O2

_Bool duckdb_je_emap_register_boundary
                (tsdn_t *tsdn,emap_t *emap,edata_t *edata,szind_t szind,_Bool slab)

{
  _Bool _Var1;
  szind_t szind_00;
  rtree_ctx_t *ctx;
  undefined1 in_stack_fffffffffffffe38;
  rtree_leaf_elm_t *elm_b;
  rtree_leaf_elm_t *elm_a;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  szind_00 = 1;
  _Var1 = emap_rtree_leaf_elms_lookup(tsdn,emap,ctx,edata,false,true,&elm_a,&elm_b);
  if (!_Var1) {
    emap_rtree_write_acquired
              ((tsdn_t *)elm_a,(emap_t *)elm_b,(rtree_leaf_elm_t *)edata,
               (rtree_leaf_elm_t *)(ulong)szind,(edata_t *)(ulong)slab,szind_00,
               (_Bool)in_stack_fffffffffffffe38);
  }
  return _Var1;
}

Assistant:

bool
emap_register_boundary(tsdn_t *tsdn, emap_t *emap, edata_t *edata,
    szind_t szind, bool slab) {
	assert(edata_state_get(edata) == extent_state_active);
	EMAP_DECLARE_RTREE_CTX;

	rtree_leaf_elm_t *elm_a, *elm_b;
	bool err = emap_rtree_leaf_elms_lookup(tsdn, emap, rtree_ctx, edata,
	    false, true, &elm_a, &elm_b);
	if (err) {
		return true;
	}
	assert(rtree_leaf_elm_read(tsdn, &emap->rtree, elm_a,
	    /* dependent */ false).edata == NULL);
	assert(rtree_leaf_elm_read(tsdn, &emap->rtree, elm_b,
	    /* dependent */ false).edata == NULL);
	emap_rtree_write_acquired(tsdn, emap, elm_a, elm_b, edata, szind, slab);
	return false;
}